

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

PropertyStringCacheMap * __thiscall
Js::JavascriptLibrary::EnsurePropertyStringMap(JavascriptLibrary *this)

{
  PropertyStringCacheMap *pPVar1;
  Recycler *alloc;
  WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>
  *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  pPVar1 = (this->propertyStringMap).ptr;
  if (pPVar1 != (PropertyStringCacheMap *)0x0) {
    return pPVar1;
  }
  local_48 = (undefined1  [8])
             &JsUtil::
              WeakReferenceRegionDictionary<int,Js::PropertyString*,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x1b20;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_48);
  this_00 = (WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x40,alloc,0x37a1d4);
  JsUtil::
  WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>
  ::WeakReferenceRegionDictionary(this_00,this->recycler,0x47);
  Memory::
  WriteBarrierPtr<JsUtil::WeakReferenceRegionDictionary<int,_Js::PropertyString_*,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock>_>
  ::WriteBarrierSet(&this->propertyStringMap,this_00);
  ScriptContext::RegisterWeakReferenceDictionary
            ((this->super_JavascriptLibraryBase).scriptContext.ptr,
             (IWeakReferenceDictionary *)(this->propertyStringMap).ptr);
  return (this->propertyStringMap).ptr;
}

Assistant:

PropertyStringCacheMap* JavascriptLibrary::EnsurePropertyStringMap()
    {
        if (this->propertyStringMap == nullptr)
        {
            this->propertyStringMap = RecyclerNew(this->recycler, PropertyStringCacheMap, this->GetRecycler(), 71);
            this->scriptContext->RegisterWeakReferenceDictionary((JsUtil::IWeakReferenceDictionary*) this->propertyStringMap);
        }
        return this->propertyStringMap;
    }